

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O3

bool __thiscall MeCab::Param::get<bool>(Param *this,char *key)

{
  const_iterator cVar1;
  ostream *poVar2;
  istream *piVar3;
  allocator aVar4;
  stringstream interpreter;
  allocator local_1c1;
  char *local_1c0;
  long local_1b8;
  char local_1b0 [16];
  undefined1 local_1a0 [128];
  ios_base local_120 [264];
  
  std::__cxx11::string::string((string *)local_1a0,key,&local_1c1);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->conf_)._M_t,(key_type *)local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_);
  }
  if ((_Rb_tree_header *)cVar1._M_node == &(this->conf_)._M_t._M_impl.super__Rb_tree_header) {
    aVar4 = (allocator)0x0;
  }
  else {
    local_1c0 = local_1b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,*(long *)(cVar1._M_node + 2),
               (long)&(cVar1._M_node[2]._M_parent)->_M_color + *(long *)(cVar1._M_node + 2));
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1a0 + 0x10),local_1c0,local_1b8);
    if (((((byte)poVar2[*(long *)(*(long *)poVar2 + -0x18) + 0x20] & 5) != 0) ||
        (piVar3 = std::istream::_M_extract<bool>((bool *)local_1a0),
        ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0)) ||
       (piVar3 = std::ws<char,std::char_traits<char>>((istream *)local_1a0), aVar4 = local_1c1,
       ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 2) == 0)) {
      aVar4 = (allocator)0x0;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0);
    }
  }
  return (bool)aVar4;
}

Assistant:

T get(const char *key) const {
    std::map<std::string, std::string>::const_iterator it = conf_.find(key);
    if (it == conf_.end()) {
      scoped_ptr<T> r(new T());
      return *r;
    }
    return lexical_cast<T, std::string>(it->second);
  }